

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

QString * insydeFlashDeviceMapEntryTypeGuidToUString(QString *__return_storage_ptr__,EFI_GUID *guid)

{
  bool bVar1;
  int iVar2;
  char *ch;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArray baGuid;
  QByteArrayView local_68;
  qsizetype local_58;
  QByteArray local_48;
  QByteArrayView local_30;
  
  QByteArray::QByteArray(&local_48,(char *)guid,0x10);
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_68,&local_48);
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_30,&INSYDE_FLASH_MAP_REGION_BOOT_FV_GUID);
  if (local_68.m_size == local_30.m_size) {
    QVar3.m_data = local_68.m_data;
    QVar3.m_size = local_68.m_size;
    QVar14.m_data = local_30.m_data;
    QVar14.m_size = local_68.m_size;
    iVar2 = QtPrivate::compareMemory(QVar3,QVar14);
    if (iVar2 != 0) goto LAB_00162c76;
    QVar9.m_data = (storage_type *)0x13;
    QVar9.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar9);
LAB_00162e87:
    (__return_storage_ptr__->d).d = (Data *)local_68.m_size;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_68.m_data;
    (__return_storage_ptr__->d).size = local_58;
    goto LAB_0016302b;
  }
LAB_00162c76:
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_68,&local_48);
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_30,&INSYDE_FLASH_MAP_REGION_BVDT_GUID);
  if (local_68.m_size == local_30.m_size) {
    QVar4.m_data = local_68.m_data;
    QVar4.m_size = local_68.m_size;
    QVar15.m_data = local_30.m_data;
    QVar15.m_size = local_68.m_size;
    iVar2 = QtPrivate::compareMemory(QVar4,QVar15);
    if (iVar2 == 0) {
      QVar10.m_data = (storage_type *)0x17;
      QVar10.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar10);
      goto LAB_00162e87;
    }
  }
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_68,&local_48);
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_30,&INSYDE_FLASH_MAP_REGION_EC_GUID);
  if (local_68.m_size == local_30.m_size) {
    QVar5.m_data = local_68.m_data;
    QVar5.m_size = local_68.m_size;
    QVar16.m_data = local_30.m_data;
    QVar16.m_size = local_68.m_size;
    iVar2 = QtPrivate::compareMemory(QVar5,QVar16);
    if (iVar2 == 0) {
      QVar11.m_data = (storage_type *)0xb;
      QVar11.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar11);
      goto LAB_00162e87;
    }
  }
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_68,&local_48);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (&local_30,&INSYDE_FLASH_MAP_REGION_FTW_BACKUP_GUID);
  if (local_68.m_size == local_30.m_size) {
    QVar6.m_data = local_68.m_data;
    QVar6.m_size = local_68.m_size;
    QVar17.m_data = local_30.m_data;
    QVar17.m_size = local_68.m_size;
    iVar2 = QtPrivate::compareMemory(QVar6,QVar17);
    if (iVar2 == 0) {
      QVar12.m_data = (storage_type *)0xa;
      QVar12.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar12);
      goto LAB_00162e87;
    }
  }
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_68,&local_48);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (&local_30,&INSYDE_FLASH_MAP_REGION_FTW_STATE_GUID);
  if (local_68.m_size == local_30.m_size) {
    QVar7.m_data = local_68.m_data;
    QVar7.m_size = local_68.m_size;
    QVar18.m_data = local_30.m_data;
    QVar18.m_size = local_68.m_size;
    iVar2 = QtPrivate::compareMemory(QVar7,QVar18);
    if (iVar2 == 0) {
      QVar13.m_data = (storage_type *)0x9;
      QVar13.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar13);
      goto LAB_00162e87;
    }
  }
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_68,&local_48);
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_30,&INSYDE_FLASH_MAP_REGION_FV_GUID);
  if (local_68.m_size == local_30.m_size) {
    QVar8.m_data = local_68.m_data;
    QVar8.m_size = local_68.m_size;
    QVar19.m_data = local_30.m_data;
    QVar19.m_size = local_68.m_size;
    iVar2 = QtPrivate::compareMemory(QVar8,QVar19);
    if (iVar2 != 0) goto LAB_00162dd9;
    ch = "Firmare Volume";
  }
  else {
LAB_00162dd9:
    bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_FLASH_DEVICE_MAP_GUID);
    if (bVar1) {
      ch = "Flash Device Map";
    }
    else {
      bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_LOGO_GUID);
      if (bVar1) {
        ch = "Logo";
      }
      else {
        bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_MICROCODE_GUID);
        if (bVar1) {
          ch = "Microcode";
        }
        else {
          bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_MSDM_TABLE_GUID);
          if (bVar1) {
            ch = "MSDM Table";
          }
          else {
            bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_MULTI_CONFIG_GUID);
            if (bVar1) {
              ch = "MultiConfig";
            }
            else {
              bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_VAR_DEFAULT_GUID);
              if (bVar1) {
                ch = "Variable Defaults";
              }
              else {
                bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_SMBIOS_UPDATE_GUID);
                if (bVar1) {
                  ch = "SMBIOS Update";
                }
                else {
                  bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_VAR_GUID);
                  if (bVar1) {
                    ch = "Variables";
                  }
                  else {
                    bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_UNKNOWN_GUID);
                    if (bVar1) {
                      ch = "Unknown";
                    }
                    else {
                      bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_UNUSED_GUID);
                      if (bVar1) {
                        ch = "Unused";
                      }
                      else {
                        bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_USB_OPTION_ROM_GUID);
                        if (bVar1) {
                          ch = "USB Option ROM";
                        }
                        else {
                          bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_DXE_FV_GUID);
                          if (bVar1) {
                            ch = "DXE Firmare Volume";
                          }
                          else {
                            bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_PEI_FV_GUID);
                            if (bVar1) {
                              ch = "PEI Firmare Volume";
                            }
                            else {
                              bVar1 = operator==(&local_48,&INSYDE_FLASH_MAP_REGION_UNSIGNED_FV_GUID
                                                );
                              if (!bVar1) {
                                guidToUString(__return_storage_ptr__,guid,true);
                                goto LAB_0016302b;
                              }
                              ch = "Unsigned Firmare Volume";
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QString::QString(__return_storage_ptr__,ch);
LAB_0016302b:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UString insydeFlashDeviceMapEntryTypeGuidToUString(const EFI_GUID & guid)
{
    const UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    if (baGuid == INSYDE_FLASH_MAP_REGION_BOOT_FV_GUID)          return UString("Boot Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_BVDT_GUID)             return UString("BIOS Version Data Table");
    if (baGuid == INSYDE_FLASH_MAP_REGION_EC_GUID)               return UString("EC Firmware");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FTW_BACKUP_GUID)       return UString("FTW Backup");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FTW_STATE_GUID)        return UString("FTW State");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FV_GUID)               return UString("Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FLASH_DEVICE_MAP_GUID) return UString("Flash Device Map");
    if (baGuid == INSYDE_FLASH_MAP_REGION_LOGO_GUID)             return UString("Logo");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MICROCODE_GUID)        return UString("Microcode");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MSDM_TABLE_GUID)       return UString("MSDM Table");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MULTI_CONFIG_GUID)     return UString("MultiConfig");
    if (baGuid == INSYDE_FLASH_MAP_REGION_VAR_DEFAULT_GUID)      return UString("Variable Defaults");
    if (baGuid == INSYDE_FLASH_MAP_REGION_SMBIOS_UPDATE_GUID)    return UString("SMBIOS Update");
    if (baGuid == INSYDE_FLASH_MAP_REGION_VAR_GUID)              return UString("Variables");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNKNOWN_GUID)          return UString("Unknown");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNUSED_GUID)           return UString("Unused");
    if (baGuid == INSYDE_FLASH_MAP_REGION_USB_OPTION_ROM_GUID)   return UString("USB Option ROM");
    if (baGuid == INSYDE_FLASH_MAP_REGION_DXE_FV_GUID)           return UString("DXE Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_PEI_FV_GUID)           return UString("PEI Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNSIGNED_FV_GUID)      return UString("Unsigned Firmare Volume");
    return guidToUString(guid);
}